

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeSSBOBlockTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::args::SsboArgData::SsboArgData
          (SsboArgData *this,ArgMember *member_,string *data_)

{
  string *data__local;
  ArgMember *member__local;
  SsboArgData *this_local;
  
  std::__cxx11::string::string((string *)&this->data);
  this->member = *member_;
  std::__cxx11::string::operator=((string *)&this->data,(string *)data_);
  return;
}

Assistant:

SsboArgData(const ArgMember& member_, const std::string& data_)
	{
		member	=	member_;
		data	=	data_;
	}